

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

parse_status_t parser_parse_chunky_body(http_parser_t *parser)

{
  size_t index;
  size_t save_pos;
  parse_status_t status;
  http_parser_t *parser_local;
  
  if ((parser->msg).msg.length - (parser->scanner).cursor < parser->chunk_size) {
    parser_local._4_4_ = PARSE_INCOMPLETE;
  }
  else {
    (parser->scanner).cursor = parser->chunk_size + (parser->scanner).cursor;
    index = (parser->scanner).cursor;
    parser_local._4_4_ = match(&parser->scanner,"%c");
    if (parser_local._4_4_ == PARSE_OK) {
      membuffer_delete(&(parser->msg).msg,index,(parser->scanner).cursor - index);
      (parser->scanner).cursor = index;
      (parser->msg).entity.length = parser->chunk_size + (parser->msg).entity.length;
      parser->ent_position = 3;
      parser_local._4_4_ = PARSE_CONTINUE_1;
    }
    else {
      (parser->scanner).cursor = (parser->scanner).cursor - parser->chunk_size;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static UPNP_INLINE parse_status_t parser_parse_chunky_body(
	http_parser_t *parser)
{
	parse_status_t status;
	size_t save_pos;

	/* if 'chunk_size' of bytes have been read; read next chunk */
	if ((parser->msg.msg.length - parser->scanner.cursor) >=
		parser->chunk_size) {
		/* move to next chunk */
		parser->scanner.cursor += parser->chunk_size;
		save_pos = parser->scanner.cursor;
		/* discard CRLF */
		status = match(&parser->scanner, "%c");
		if (status != (parse_status_t)PARSE_OK) {
			/*move back */
			parser->scanner.cursor -= parser->chunk_size;
			/*parser->scanner.cursor = save_pos; */
			return status;
		}
		membuffer_delete(&parser->msg.msg,
			save_pos,
			(parser->scanner.cursor - save_pos));
		parser->scanner.cursor = save_pos;
		/*update temp  */
		parser->msg.entity.length += parser->chunk_size;
		parser->ent_position = ENTREAD_USING_CHUNKED;
		return PARSE_CONTINUE_1;
	} else
		/* need more data for chunk */
		return PARSE_INCOMPLETE;
}